

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtBox2dBox2dCollisionAlgorithm.cpp
# Opt level: O2

cbtScalar EdgeSeparation(cbtBox2dShape *poly1,cbtTransform *xf1,int edge1,cbtBox2dShape *poly2,
                        cbtTransform *xf2)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  long lVar3;
  undefined1 in_ZMM0 [64];
  undefined1 auVar8 [56];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar11 [56];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  cbtVector3 cVar12;
  cbtVector3 cVar13;
  float local_b8;
  cbtVector3 normal1;
  cbtVector3 normal1World;
  cbtScalar minDot;
  
  auVar11 = in_ZMM1._8_56_;
  auVar8 = in_ZMM0._8_56_;
  cVar12 = operator*(&xf1->m_basis,poly1->m_normals + edge1);
  auVar9._0_8_ = cVar12.m_floats._8_8_;
  auVar9._8_56_ = auVar11;
  auVar4._0_8_ = cVar12.m_floats._0_8_;
  auVar4._8_56_ = auVar8;
  normal1World.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar4._0_16_,auVar9._0_16_);
  auVar8 = ZEXT856(normal1World.m_floats._8_8_);
  cbtMatrix3x3::transpose((cbtMatrix3x3 *)&minDot,&xf2->m_basis);
  cVar12 = operator*((cbtMatrix3x3 *)&minDot,&normal1World);
  auVar10._0_8_ = cVar12.m_floats._8_8_;
  auVar10._8_56_ = auVar11;
  auVar5._0_8_ = cVar12.m_floats._0_8_;
  auVar5._8_56_ = auVar8;
  normal1.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar5._0_16_,auVar10._0_16_);
  auVar8 = ZEXT856(normal1.m_floats._8_8_);
  minDot = 1e+18;
  lVar3 = cbtVector3::minDot(&normal1,poly2->m_vertices,4,&minDot);
  cVar12 = cbtTransform::operator()(xf1,poly1->m_vertices + edge1);
  auVar6._0_8_ = cVar12.m_floats._0_8_;
  auVar6._8_56_ = auVar8;
  cVar13 = cbtTransform::operator()(xf2,poly2->m_vertices + (int)lVar3);
  auVar7._0_8_ = cVar13.m_floats._0_8_;
  auVar7._8_56_ = auVar8;
  auVar2 = vsubps_avx(auVar7._0_16_,auVar6._0_16_);
  local_b8 = cVar12.m_floats[2];
  auVar1 = vmovshdup_avx(auVar2);
  auVar1 = vfmadd231ss_fma(ZEXT416((uint)(auVar1._0_4_ * normal1World.m_floats[1])),auVar2,
                           ZEXT416((uint)normal1World.m_floats[0]));
  auVar1 = vfmadd231ss_fma(auVar1,ZEXT416((uint)(cVar13.m_floats[2] - local_b8)),
                           ZEXT416((uint)normal1World.m_floats[2]));
  return auVar1._0_4_;
}

Assistant:

static cbtScalar EdgeSeparation(const cbtBox2dShape* poly1, const cbtTransform& xf1, int edge1,
							   const cbtBox2dShape* poly2, const cbtTransform& xf2)
{
	const cbtVector3* vertices1 = poly1->getVertices();
	const cbtVector3* normals1 = poly1->getNormals();

	int count2 = poly2->getVertexCount();
	const cbtVector3* vertices2 = poly2->getVertices();

	cbtAssert(0 <= edge1 && edge1 < poly1->getVertexCount());

	// Convert normal from poly1's frame into poly2's frame.
	cbtVector3 normal1World = b2Mul(xf1.getBasis(), normals1[edge1]);
	cbtVector3 normal1 = b2MulT(xf2.getBasis(), normal1World);

	// Find support vertex on poly2 for -normal.
	int index = 0;
	cbtScalar minDot = BT_LARGE_FLOAT;

	if (count2 > 0)
		index = (int)normal1.minDot(vertices2, count2, minDot);

	cbtVector3 v1 = b2Mul(xf1, vertices1[edge1]);
	cbtVector3 v2 = b2Mul(xf2, vertices2[index]);
	cbtScalar separation = b2Dot(v2 - v1, normal1World);
	return separation;
}